

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O3

void __thiscall SharedDirectory::on_finished_writing(SharedDirectory *this,string *name)

{
  pointer pcVar1;
  pointer pcVar2;
  iterator __position;
  Error *pEVar3;
  uint64_t size;
  path p;
  undefined1 local_70 [8];
  path local_68;
  string local_48;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::find(&(this->pending_files)._M_t,name);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->pending_files)._M_t._M_impl.super__Rb_tree_header) {
    pEVar3 = (Error *)__cxa_allocate_exception(0x3f0);
    Error::Error(pEVar3,"Not registered file");
    __cxa_throw(pEVar3,&Error::typeinfo,std::exception::~exception);
  }
  pcVar1 = *(pointer *)(__position._M_node + 2);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
  ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      *)&this->pending_files,__position);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + name->_M_string_length);
  path_in_dir(&local_68,this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  boost::filesystem::detail::status((path *)local_70,(error_code *)&local_68);
  if (1 < (uint)local_70._0_4_) {
    local_70 = (undefined1  [8])boost::filesystem::detail::file_size(&local_68,(error_code *)0x0);
    if (pcVar1 < (ulong)local_70) {
      boost::filesystem::detail::remove(&local_68,(error_code *)0x0);
      this->remaining_space = (uint64_t)(pcVar1 + this->remaining_space);
    }
    else {
      this->remaining_space = (uint64_t)(pcVar1 + (this->remaining_space - (long)local_70));
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
      ::_M_emplace_unique<std::__cxx11::string&,unsigned_long&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_long>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                  *)this,name,(unsigned_long *)local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.m_pathname._M_dataplus._M_p != &local_68.m_pathname.field_2) {
      operator_delete(local_68.m_pathname._M_dataplus._M_p,
                      local_68.m_pathname.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  pEVar3 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(pEVar3,"File not exists");
  __cxa_throw(pEVar3,&Error::typeinfo,std::exception::~exception);
}

Assistant:

void SharedDirectory::on_finished_writing(std::string name) {
  auto it = pending_files.find(name);
  if (it == pending_files.end()) {
    throw Error("Not registered file");
  }
  uint64_t promised_size = it->second;
  pending_files.erase(it);
  path p = path_in_dir(name);
  if (!exists(p)) {
    throw Error("File not exists");
  }
  uint64_t size = file_size(p);
  if (size > promised_size) {
    remove(p);
    remaining_space += promised_size;
  } else {
    remaining_space += promised_size - size;
    indexed_files.emplace(name, size);
  }
}